

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# keyValueFile.h
# Opt level: O0

bool __thiscall KeyValueFile::includeFile(KeyValueFile *this,char *inc_file_name,int include_depth)

{
  code *pcVar1;
  undefined1 uVar2;
  bool bVar3;
  int iVar4;
  undefined8 uVar5;
  char *pcVar6;
  vector<KeyValueFile::StringKeyValue,_std::allocator<KeyValueFile::StringKeyValue>_> *this_00;
  int in_EDX;
  char *in_RSI;
  long *in_RDI;
  StringKeyValue *value;
  iterator __end2;
  iterator __begin2;
  vector<KeyValueFile::StringKeyValue,_std::allocator<KeyValueFile::StringKeyValue>_> *__range2;
  bool ok;
  KeyValueFile kvFile;
  string combinedFileName;
  int len;
  char *in_stack_00000180;
  KeyValueFile *in_stack_00000188;
  vector<KeyValueFile::StringKeyValue,_std::allocator<KeyValueFile::StringKeyValue>_>
  *in_stack_fffffffffffffe88;
  char *in_stack_fffffffffffffe90;
  KeyValueFile *this_01;
  undefined7 in_stack_fffffffffffffe98;
  undefined1 in_stack_fffffffffffffe9f;
  __normal_iterator<KeyValueFile::StringKeyValue_*,_std::vector<KeyValueFile::StringKeyValue,_std::allocator<KeyValueFile::StringKeyValue>_>_>
  local_120;
  vector<KeyValueFile::StringKeyValue,_std::allocator<KeyValueFile::StringKeyValue>_> *local_118;
  byte local_109;
  KeyValueFile local_108;
  allocator local_b9;
  string local_b8 [32];
  int local_98;
  allocator local_81;
  string local_80 [32];
  string local_60 [32];
  string local_40 [36];
  int local_1c;
  char *local_18;
  byte local_1;
  
  if (in_EDX < 0x10) {
    local_1c = in_EDX;
    local_18 = in_RSI;
    local_98 = std::__cxx11::string::length();
    do {
      local_98 = local_98 + -1;
      if ((local_98 < 0) ||
         (pcVar6 = (char *)std::__cxx11::string::operator[]((ulong)(in_RDI + 1)), *pcVar6 == '\\'))
      break;
      pcVar6 = (char *)std::__cxx11::string::operator[]((ulong)(in_RDI + 1));
    } while (*pcVar6 != '/');
    this_00 = (vector<KeyValueFile::StringKeyValue,_std::allocator<KeyValueFile::StringKeyValue>_> *
              )std::__cxx11::string::c_str();
    iVar4 = local_98 + 1;
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_b8,(char *)this_00,(long)iVar4,&local_b9);
    std::allocator<char>::~allocator((allocator<char> *)&local_b9);
    std::__cxx11::string::operator+=(local_b8,local_18);
    this_01 = &local_108;
    KeyValueFile(this_01);
    local_108.includeDepth = local_1c + 1;
    local_108.printErrorFunc = (PrintErrorFunc)*in_RDI;
    std::__cxx11::string::c_str();
    uVar2 = loadFromFile(in_stack_00000188,in_stack_00000180);
    local_109 = uVar2;
    if ((bool)uVar2) {
      local_118 = &local_108.kv;
      local_120._M_current =
           (StringKeyValue *)
           std::vector<KeyValueFile::StringKeyValue,_std::allocator<KeyValueFile::StringKeyValue>_>
           ::begin(in_stack_fffffffffffffe88);
      std::vector<KeyValueFile::StringKeyValue,_std::allocator<KeyValueFile::StringKeyValue>_>::end
                (in_stack_fffffffffffffe88);
      while (bVar3 = __gnu_cxx::operator!=
                               ((__normal_iterator<KeyValueFile::StringKeyValue_*,_std::vector<KeyValueFile::StringKeyValue,_std::allocator<KeyValueFile::StringKeyValue>_>_>
                                 *)this_01,
                                (__normal_iterator<KeyValueFile::StringKeyValue_*,_std::vector<KeyValueFile::StringKeyValue,_std::allocator<KeyValueFile::StringKeyValue>_>_>
                                 *)in_stack_fffffffffffffe88), bVar3) {
        __gnu_cxx::
        __normal_iterator<KeyValueFile::StringKeyValue_*,_std::vector<KeyValueFile::StringKeyValue,_std::allocator<KeyValueFile::StringKeyValue>_>_>
        ::operator*(&local_120);
        std::vector<KeyValueFile::StringKeyValue,_std::allocator<KeyValueFile::StringKeyValue>_>::
        push_back(this_00,(value_type *)CONCAT17(uVar2,in_stack_fffffffffffffe98));
        __gnu_cxx::
        __normal_iterator<KeyValueFile::StringKeyValue_*,_std::vector<KeyValueFile::StringKeyValue,_std::allocator<KeyValueFile::StringKeyValue>_>_>
        ::operator++(&local_120);
      }
    }
    local_1 = local_109 & 1;
    ~KeyValueFile(this_01);
    std::__cxx11::string::~string(local_b8);
  }
  else {
    if (*in_RDI != 0) {
      pcVar1 = (code *)*in_RDI;
      std::allocator<char>::allocator();
      std::__cxx11::string::string
                (local_80,"ERROR: Maximum include depth exceeded on file \'",&local_81);
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     CONCAT17(in_stack_fffffffffffffe9f,in_stack_fffffffffffffe98),
                     in_stack_fffffffffffffe90);
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     CONCAT17(in_stack_fffffffffffffe9f,in_stack_fffffffffffffe98),
                     in_stack_fffffffffffffe90);
      uVar5 = std::__cxx11::string::c_str();
      (*pcVar1)(uVar5);
      std::__cxx11::string::~string(local_40);
      std::__cxx11::string::~string(local_60);
      std::__cxx11::string::~string(local_80);
      std::allocator<char>::~allocator((allocator<char> *)&local_81);
    }
    local_1 = 0;
  }
  return (bool)(local_1 & 1);
}

Assistant:

bool includeFile(const char * inc_file_name, int include_depth)
  {
    if (include_depth >= 16)
    {
      if (printErrorFunc)
        printErrorFunc(
          (std::string("ERROR: Maximum include depth exceeded on file '") + inc_file_name + "'\n").c_str());
      return false;
    }

    int len = int(fileName.length()) - 1;
    while (len >= 0)
    {
      if (fileName[len] == '\\' || fileName[len] == '/')
        break;
      len--;
    }

    std::string combinedFileName(fileName.c_str(), len + 1);
    combinedFileName += inc_file_name;

    KeyValueFile kvFile;
    kvFile.includeDepth = include_depth + 1;
    kvFile.printErrorFunc = printErrorFunc;

    bool ok = kvFile.loadFromFile(combinedFileName.c_str());

    if (ok)
      for (auto && value : kvFile.kv)
        kv.push_back(value);

    return ok;
  }